

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void CTPNCodeBody::enum_for_param_ctx(void *param_1,CTcSymbol *sym)

{
  CTcSymLocal *lcl;
  
  if (((*(uint *)&(sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 &
       0xfffffffe) == 4) &&
     ((~*(uint *)((long)&sym[2].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.str_ + 4
                 ) & 0x11) == 0)) {
    CTcSymLocal::s_gen_code_getlcl
              (*(int *)&sym[1].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.str_,1);
    (*(sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry[0x19])
              (sym,1,1,0,"=",0,1,0,0);
  }
  return;
}

Assistant:

void CTcGenTarg::load_image_file_meta_table(
    const char *nm, size_t len, int idx)
{
    /* 
     *   Check the name against our known names.  If it matches one of the
     *   known types, store the actual index in our translation table under
     *   our internal index entry.  If it's not a known name, ignore it - we
     *   only care about the names we actually pre-define, because those are
     *   the only ones we need to generate our own code for.  
     */
    if (len == 11 && memcmp(nm, "tads-object", 11) == 0)
        predef_meta_idx_[TCT3_METAID_TADSOBJ] = idx;
    else if (len == 4 && memcmp(nm, "list", 4) == 0)
        predef_meta_idx_[TCT3_METAID_LIST] = idx;
    else if (len == 11 && memcmp(nm, "dictionary2", 11) == 0)
        predef_meta_idx_[TCT3_METAID_DICT] = idx;
    else if (len == 18 && memcmp(nm, "grammar-production", 18) == 0)
        predef_meta_idx_[TCT3_METAID_GRAMPROD] = idx;
    else if (len == 6 && memcmp(nm, "vector", 6) == 0)
        predef_meta_idx_[TCT3_METAID_VECTOR] = idx;
    else if (len == 13 && memcmp(nm, "anon-func-ptr", 13) == 0)
        predef_meta_idx_[TCT3_METAID_ANONFN] = idx;
    else if (len == 13 && memcmp(nm, "int-class-mod", 13) == 0)
        predef_meta_idx_[TCT3_METAID_ICMOD] = idx;
    else if (len == 11 && memcmp(nm, "lookuptable", 11) == 0)
        predef_meta_idx_[TCT3_METAID_LOOKUP_TABLE] = idx;
}